

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

LIBSSH2_COMMON_METHOD *
kex_get_method_by_name(char *name,size_t name_len,LIBSSH2_COMMON_METHOD **methodlist)

{
  LIBSSH2_COMMON_METHOD *pLVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  
  while( true ) {
    pLVar1 = *methodlist;
    if (pLVar1 == (LIBSSH2_COMMON_METHOD *)0x0) {
      return (LIBSSH2_COMMON_METHOD *)0x0;
    }
    __s = pLVar1->name;
    sVar3 = strlen(__s);
    if ((sVar3 == name_len) && (iVar2 = strncmp(__s,name,name_len), iVar2 == 0)) break;
    methodlist = methodlist + 1;
  }
  return pLVar1;
}

Assistant:

static const LIBSSH2_COMMON_METHOD *
kex_get_method_by_name(const char *name, size_t name_len,
                       const LIBSSH2_COMMON_METHOD ** methodlist)
{
    while (*methodlist) {
        if ((strlen((*methodlist)->name) == name_len) &&
            (strncmp((*methodlist)->name, name, name_len) == 0)) {
            return *methodlist;
        }
        methodlist++;
    }
    return NULL;
}